

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall DifferingTypesTest::constructionTest(DifferingTypesTest *this)

{
  short sVar1;
  short sVar2;
  int iVar3;
  reference psVar4;
  reference piVar5;
  size_t j_1;
  size_t j;
  ulong uVar6;
  View<short,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator_type local_f9;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_f8;
  Marray<int,_std::allocator<unsigned_long>_> local_e0;
  unsigned_long local_98 [4];
  Marray<int,_std::allocator<unsigned_long>_> local_78;
  
  local_98[0] = 3;
  local_98[1] = 2;
  local_98[2] = 4;
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)&local_e0,local_98,local_98 + 3,
             this->dataShort_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_78);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<short,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_78,
             (View<short,_false,_std::allocator<unsigned_long>_> *)&local_e0);
  local_f8.e1_._0_1_ =
       local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       local_78.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&local_f8);
  for (uVar6 = 0;
      uVar6 < local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar6 = uVar6 + 1) {
    psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_e0,uVar6);
    sVar1 = *psVar4;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_78.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar6);
    local_f8.e1_._0_1_ = *piVar5 == (int)sVar1;
    test((bool *)&local_f8);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_78);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_98[0] = 3;
  local_98[1] = 2;
  local_98[2] = 4;
  andres::View<short,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<short,false,std::allocator<unsigned_long>> *)&local_e0,local_98,local_98 + 3,
             this->dataShort_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_78);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_f8,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             &local_e0,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             &local_e0);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_78,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&local_f8,&local_f9);
  local_f8.e1_._0_1_ =
       local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       local_78.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&local_f8);
  for (uVar6 = 0;
      uVar6 < local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar6 = uVar6 + 1) {
    psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_e0,uVar6);
    sVar1 = *psVar4;
    psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_e0,uVar6);
    sVar2 = *psVar4;
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_78.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar6);
    local_f8.e1_._0_1_ = (int)sVar2 + (int)sVar1 == *piVar5;
    test((bool *)&local_f8);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_78);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            (&local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_);
  local_98[0] = 3;
  local_98[1] = 2;
  local_98[2] = 4;
  local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.data_._0_2_ = 0;
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)&local_78,local_98,local_98 + 3,
             (short *)&local_e0,&andres::defaultOrder,(allocator_type *)&local_f8);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<short,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_e0,
             (View<short,_false,_std::allocator<unsigned_long>_> *)&local_78);
  local_f8.e1_._0_1_ =
       local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
       local_78.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
  test((bool *)&local_f8);
  for (uVar6 = 0;
      uVar6 < local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_;
      uVar6 = uVar6 + 1) {
    piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (&local_e0.super_View<int,_false,_std::allocator<unsigned_long>_>,uVar6);
    iVar3 = *piVar5;
    psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_78,uVar6);
    local_f8.e1_._0_1_ = iVar3 == *psVar4;
    test((bool *)&local_f8);
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray(&local_e0);
  andres::Marray<short,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<short,_std::allocator<unsigned_long>_> *)&local_78);
  return;
}

Assistant:

void DifferingTypesTest::constructionTest()
{
    // Marray
    {
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m(v);
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m(v + v);
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n(m);
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}